

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 in_register_0000003c;
  string *psVar4;
  int iVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  text *line;
  
  psVar4 = (string *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_68,psVar4);
    bVar2 = hidden(&local_68);
    uVar6 = (uint)CONCAT71(extraout_var,bVar2);
LAB_001066de:
    uVar6 = uVar6 ^ 1;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
    line = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __readfds->fds_bits[1];
    do {
      do {
        __lhs = pbVar1 + -1;
        if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __readfds->fds_bits[0]) {
          if (bVar2) {
            std::__cxx11::string::string((string *)&local_e8,psVar4);
            bVar2 = hidden(&local_e8);
            uVar6 = (uint)CONCAT71(extraout_var_00,bVar2);
            goto LAB_001066de;
          }
          goto LAB_0010670f;
        }
        bVar2 = std::operator==(__lhs,"@");
        line = (text *)CONCAT71((int7)((ulong)line >> 8),1);
        iVar5 = (int)line;
        if (bVar2) {
          return iVar5;
        }
        bVar2 = std::operator==(__lhs,"*");
        if (bVar2) {
          return iVar5;
        }
        std::__cxx11::string::string((string *)&local_88,(string *)__lhs);
        std::__cxx11::string::string((string *)&local_a8,psVar4);
        bVar2 = search(&local_88,&local_a8);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        if (bVar2) {
          return iVar5;
        }
        bVar2 = *(__lhs->_M_dataplus)._M_p == '!';
        pbVar1 = __lhs;
      } while (!bVar2);
      std::__cxx11::string::substr((ulong)&local_108,(ulong)__lhs);
      line = &local_c8;
      std::__cxx11::string::string((string *)line,psVar4);
      bVar3 = search(&local_108,line);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    } while (!bVar3);
LAB_0010670f:
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}